

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_cmpm_16(void)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = OPER_AY_PI_16();
  uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  uVar2 = *(uint *)((long)m68ki_cpu.dar + uVar3 + 0x20);
  *(uint *)((long)m68ki_cpu.dar + uVar3 + 0x20) = uVar2 + 2;
  uVar2 = m68ki_read_16_fc(uVar2,m68ki_address_space | m68ki_cpu.s_flag);
  uVar4 = uVar2 - uVar1;
  m68ki_cpu.n_flag = uVar4 >> 8;
  m68ki_cpu.not_z_flag = uVar4 & 0xffff;
  m68ki_cpu.v_flag = ((uVar4 ^ uVar2) & (uVar1 ^ uVar2)) >> 8;
  m68ki_cpu.c_flag = uVar4 >> 8;
  return;
}

Assistant:

static void m68k_op_cmpm_16(void)
{
	uint src = OPER_AY_PI_16();
	uint dst = OPER_AX_PI_16();
	uint res = dst - src;

	FLAG_N = NFLAG_16(res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);
	FLAG_V = VFLAG_SUB_16(src, dst, res);
	FLAG_C = CFLAG_16(res);
}